

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

QString * rawWeekDayName(QLocaleData *data,int day,FormatType type)

{
  long lVar1;
  int in_ECX;
  QLocaleData *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  DataRange range;
  QString *pQVar2;
  undefined4 in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = in_RDI;
  if (in_ECX == 0) {
    QLocaleData::longDayNames(in_RSI);
  }
  else if (in_ECX == 1) {
    QLocaleData::shortDayNames(in_RSI);
  }
  else {
    if (in_ECX != 2) {
      QString::QString((QString *)0x4d2baf);
      pQVar2 = in_RDI;
      goto LAB_004d2be5;
    }
    QLocaleData::narrowDayNames(in_RSI);
  }
  QLocaleData::DataRange::getListEntry
            ((DataRange *)CONCAT44(in_ECX,in_stack_ffffffffffffffb8),(char16_t *)pQVar2,
             (qsizetype)in_RDI);
LAB_004d2be5:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pQVar2;
  }
  __stack_chk_fail();
}

Assistant:

static QString rawWeekDayName(const QLocaleData *data, const int day,
                              QLocale::FormatType type)
{
    QLocaleData::DataRange range;
    switch (type) {
    case QLocale::LongFormat:
        range = data->longDayNames();
        break;
    case QLocale::ShortFormat:
        range = data->shortDayNames();
        break;
    case QLocale::NarrowFormat:
        range = data->narrowDayNames();
        break;
    default:
        return QString();
    }
    return range.getListEntry(days_data, day == 7 ? 0 : day);
}